

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory.cc
# Opt level: O3

void __thiscall lf::mesh::hybrid2d::MeshFactory::PrintLists(MeshFactory *this,ostream *o)

{
  __uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> _Var1;
  ostream *poVar2;
  int l;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  char local_71;
  char local_70;
  undefined7 uStack_6f;
  ulong local_58;
  char *local_50;
  void *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"hybrid2d::MeshFactory: Internal information",0x2b);
  local_70 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(o,&local_70,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," nodes:",7);
  local_70 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_70,1);
  if ((this->nodes_).
      super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->nodes_).
      super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o,"Node ",5);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," at ",4);
      _Var1._M_t.
      super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
      .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl =
           (this->nodes_).
           super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
           super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
           ._M_t;
      if ((_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>)
          _Var1._M_t.
          super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
          .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl == (Geometry *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"with unknown location!",0x16);
        local_70 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(o,&local_70,1);
      }
      else {
        local_48 = (void *)0x0;
        uStack_40 = 0;
        local_38 = 1;
        (**(code **)(*(long *)_Var1._M_t.
                              super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                              .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl +
                    0x18))(&local_70,
                           _Var1._M_t.
                           super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                           .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl,
                           &local_48);
        local_50 = &local_70;
        poVar2 = Eigen::operator<<(o,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                      *)&local_50);
        local_71 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_71,1);
        free((void *)CONCAT71(uStack_6f,local_70));
        free(local_48);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->nodes_).
                                   super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->nodes_).
                                   super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," edges ",7);
  local_70 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_70,1);
  if ((this->edges_).
      super__Vector_base<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->edges_).
      super__Vector_base<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o,"Edge ",5);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," <-> ",5);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      if (*(long *)((long)&(((unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                              *)(&((this->edges_).
                                   super__Vector_base<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first + 1))->_M_t).
                           super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                   + lVar6) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(o," with geometry",0xe);
      }
      local_70 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(o,&local_70,1);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < (ulong)((long)(this->edges_).
                                   super__Vector_base<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->edges_).
                                   super__Vector_base<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," cells ",7);
  local_70 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_70,1);
  if ((this->elements_).
      super__Vector_base<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->elements_).
      super__Vector_base<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o,"Cell ",5);
      local_58 = uVar5;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
      lVar3 = 0;
      do {
        if (*(int *)((long)(((this->elements_).
                             super__Vector_base<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first)._M_elems +
                    lVar3 * 4 + lVar6) != -1) {
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      if ((_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>)
          (this->elements_).
          super__Vector_base<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[local_58].second._M_t.
          super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
          ._M_t == (_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                    )0x0) {
        lVar3 = 0xd;
        pcVar4 = "[no geometry]";
      }
      else {
        lVar3 = 0xe;
        pcVar4 = " with geometry";
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,pcVar4,lVar3);
      local_70 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(o,&local_70,1);
      uVar5 = local_58 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar5 < (ulong)(((long)(this->elements_).
                                    super__Vector_base<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->elements_).
                                    super__Vector_base<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  return;
}

Assistant:

void MeshFactory::PrintLists(std::ostream& o) const {
  o << "hybrid2d::MeshFactory: Internal information" << '\n';
  o << nodes_.size() << " nodes:" << '\n';
  for (std::size_t j = 0; j < nodes_.size(); j++) {
    o << "Node " << j << " at ";
    if (nodes_[j] != nullptr) {
      o << (nodes_[j]->Global(Eigen::Matrix<double, 0, 1>())).transpose()
        << '\n';
    } else {
      o << "with unknown location!" << '\n';
    }
  }
  o << edges_.size() << " edges " << '\n';
  for (std::size_t j = 0; j < edges_.size(); j++) {
    o << "Edge " << j << ": " << edges_[j].first[0] << " <-> "
      << edges_[j].first[1];
    if (edges_[j].second) {
      o << " with geometry";
    }
    o << '\n';
  }

  std::cout << elements_.size() << " cells " << '\n';
  for (std::size_t j = 0; j < elements_.size(); j++) {
    o << "Cell " << j << " : ";
    for (int l = 0; l < 4; l++) {
      if (elements_[j].first[l] != static_cast<size_type>(-1)) {
        o << elements_[j].first[l] << " ";
      }
    }
    if (elements_[j].second) {
      o << " with geometry";
    } else {
      o << "[no geometry]";
    }
    o << '\n';
  }
}